

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

Hash __thiscall
Fossilize::Hashing::compute_hash_physical_device_features(Hashing *this,void *device_pnext)

{
  uint uVar1;
  VkPhysicalDeviceFeatures2 *pVVar2;
  uint *pNext;
  Hash HVar3;
  ulong uVar4;
  long lStack_60;
  allocator local_51;
  string local_50;
  
  HVar3 = 0xaf63bd4c8601b7df;
  pVVar2 = find_pnext<VkPhysicalDeviceFeatures2>((VkStructureType)this,device_pnext);
  if (pVVar2 != (VkPhysicalDeviceFeatures2 *)0x0) {
    HVar3 = (ulong)(pVVar2->features).robustBufferAccess ^ 0xaf63bd4c8601b7df;
  }
  do {
    pNext = (uint *)pnext_chain_pdf2_skip_ignored_entries(this);
    if (pNext == (uint *)0x0) {
      return HVar3;
    }
    uVar1 = *pNext;
    uVar4 = HVar3 * 0x100000001b3 ^ (ulong)uVar1;
    if ((ulong)uVar1 == 0x3b9ddf10) {
LAB_0014747e:
      uVar1 = pNext[4];
LAB_00147501:
      uVar4 = uVar4 * 0x100000001b3 ^ (ulong)uVar1;
      lStack_60 = 0x14;
    }
    else if (uVar1 == 0x3b9e3cd3) {
LAB_00147458:
      uVar4 = (uVar4 * 0x100000001b3 ^ (ulong)pNext[4]) * 0x100000001b3 ^ (ulong)pNext[5];
      lStack_60 = 0x18;
    }
    else {
      lStack_60 = 0x10;
      if (uVar1 != 0x3ba224d0) {
        if (uVar1 == 0x3b9f9c62) {
          uVar4 = ((uVar4 * 0x100000001b3 ^ (ulong)pNext[4]) * 0x100000001b3 ^ (ulong)pNext[5]) *
                  0x100000001b3 ^ (ulong)pNext[6];
          lStack_60 = 0x1c;
        }
        else {
          if (uVar1 == 0x3b9fc371) {
            uVar1 = pNext[4];
            uVar4 = uVar4 * 0x100000001b3 ^ (ulong)pNext[6];
            goto LAB_00147501;
          }
          if (uVar1 == 0x3b9fcb40) {
            uVar4 = (((uVar4 * 0x100000001b3 ^ (ulong)pNext[4]) * 0x100000001b3 ^ (ulong)pNext[5]) *
                     0x100000001b3 ^ (ulong)pNext[6]) * 0x100000001b3 ^ (ulong)pNext[7];
            lStack_60 = 0x20;
          }
          else if (uVar1 != 0x3b9fe698) {
            if (uVar1 != 0x3ba09e30) {
              if (uVar1 == 0x3ba0c928) goto LAB_0014747e;
              if (uVar1 != 0x3b9f2730) {
                std::__cxx11::string::string
                          ((string *)&local_50,"Unsupported pNext found, cannot hash.",&local_51);
                log_error_pnext_chain(&local_50,pNext);
                std::__cxx11::string::_M_dispose();
                return uVar4;
              }
              goto LAB_00147458;
            }
            uVar4 = (uVar4 * 0x100000001b3 ^ (ulong)pNext[4]) * 0x100000001b3 ^ (ulong)pNext[6];
            lStack_60 = 0x14;
          }
        }
      }
    }
    HVar3 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)pNext + lStack_60);
    this = *(Hashing **)(pNext + 2);
  } while( true );
}

Assistant:

static Hash compute_hash_physical_device_features(const void *device_pnext)
{
	Hasher h;

	// For hash invariance, make sure we hash PDF2 first, since when we serialize and unserialize,
	// PDF2 will always come first in the chain.
	auto *pdf2 = find_pnext<VkPhysicalDeviceFeatures2>(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2, device_pnext);
	if (pdf2)
		h.u32(pdf2->features.robustBufferAccess);
	else
		h.u32(0);

	hash_pnext_chain_pdf2(nullptr, h, device_pnext);
	return h.get();
}